

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locbased.cpp
# Opt level: O3

void __thiscall icu_63::LocaleBased::setLocaleIDs(LocaleBased *this,char *validID,char *actualID)

{
  if (validID != (char *)0x0) {
    strncpy(this->valid,validID,0x9d);
    this->valid[0x9c] = '\0';
  }
  if (actualID != (char *)0x0) {
    strncpy(this->actual,actualID,0x9d);
    this->actual[0x9c] = '\0';
  }
  return;
}

Assistant:

void LocaleBased::setLocaleIDs(const char* validID, const char* actualID) {
    if (validID != 0) {
      uprv_strncpy(valid, validID, ULOC_FULLNAME_CAPACITY);
      valid[ULOC_FULLNAME_CAPACITY-1] = 0; // always terminate
    }
    if (actualID != 0) {
      uprv_strncpy(actual, actualID, ULOC_FULLNAME_CAPACITY);
      actual[ULOC_FULLNAME_CAPACITY-1] = 0; // always terminate
    }
}